

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O1

void anon_unknown.dwarf_2b983c::writeReadLayers(string *tempDir,bool multiPart)

{
  float *pfVar1;
  pointer *ppFVar2;
  float fVar3;
  float fVar4;
  pointer pcVar5;
  pointer pFVar6;
  _Alloc_hider _Var7;
  pointer pHVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  void *pvVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  undefined7 in_register_00000031;
  char *pcVar16;
  long lVar17;
  void *pvVar18;
  char *pcVar19;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> fb;
  MultiPartOutputFile out;
  string fileName;
  OutputPart part1;
  OutputPart part0;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  
  if ((int)CONCAT71(in_register_00000031,multiPart) == 0) {
    pcVar16 = "\nreading multi-layer file";
    lVar14 = 0x19;
  }
  else {
    pcVar16 = "\nreading multi-part file";
    lVar14 = 0x18;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,lVar14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
  pcVar5 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&fileName,pcVar5,pcVar5 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&fileName);
  pcVar16 = (char *)operator_new__(0xdc56);
  pcVar10 = (char *)operator_new__(0xdc56);
  _GLOBAL__N_1::writeReadLayers();
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
            (&headers,2,(allocator_type *)&out);
  fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Imf_3_2::Header::Header((Header *)&out,0xed,0x77,1.0,(Vec2 *)&fb,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_2::Header::setType((string *)&out);
  Imf_3_2::Header::operator=
            (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start,(Header *)&out);
  pHVar8 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppFVar2 = &fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppFVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"rgba_layer","");
  Imf_3_2::Header::setName((string *)pHVar8);
  if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppFVar2) {
    operator_delete(fb.
                    super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)&((fb.
                              super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                            _M_impl.field_0x1);
  }
  if (multiPart) {
    Imf_3_2::Header::operator=
              (headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl
               .super__Vector_impl_data._M_start + 0x38,(Header *)&out);
    pHVar8 = headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start;
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"foo_layer","");
    Imf_3_2::Header::setName((string *)(pHVar8 + 0x38));
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
  }
  Imf_3_2::Header::~Header((Header *)&out);
  pcVar11 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x1bd903);
  pcVar11 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"foo.R");
  std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::vector
            (&fb,2,(allocator_type *)&out);
  pFVar6 = fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Imf_3_2::Slice::Slice((Slice *)&out,HALF,pcVar16,2,0x1da,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)pFVar6,(Slice *)0x1bd903);
  pFVar6 = fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  Imf_3_2::Slice::Slice((Slice *)&out,HALF,pcVar10,2,0x1da,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert
            (&(pFVar6->_map)._M_t._M_impl.field_0x0 + (uint)multiPart * 0x30,(Slice *)"foo.R");
  _Var7 = fileName._M_dataplus;
  iVar9 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            (&out,_Var7._M_p,
             headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
             super__Vector_impl_data._M_start,multiPart + 1,false,iVar9);
  Imf_3_2::OutputPart::OutputPart(&part0,&out,0);
  Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&part0);
  Imf_3_2::OutputPart::writePixels((int)&part0);
  if (multiPart) {
    Imf_3_2::OutputPart::OutputPart(&part1,&out,1);
    Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&part1);
    Imf_3_2::OutputPart::writePixels((int)&part1);
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&out);
  std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::~vector(&fb);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&headers);
  pvVar12 = operator_new__(0x37158);
  _Var7 = fileName._M_dataplus;
  if (multiPart) {
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"");
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var7._M_p,(string *)&fb,iVar9);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
  }
  else {
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>();
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,0,_Var7._M_p,(string *)&fb,iVar9);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  lVar14 = (long)pvVar12 + 6;
  lVar15 = 0;
  pcVar11 = pcVar16;
  do {
    lVar17 = 0;
    do {
      fVar3 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)(lVar14 + -6 + lVar17 * 8) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)*(ushort *)(pcVar11 + lVar17 * 2) * 4);
      if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
        __assert_fail("p3[y][x].r == p1[y][x]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1be,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar3 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)(lVar14 + -4 + lVar17 * 8) * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        __assert_fail("p3[y][x].g == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1bf,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar3 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)(lVar14 + -2 + lVar17 * 8) * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        __assert_fail("p3[y][x].b == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1c0,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar3 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(lVar14 + lVar17 * 8) * 4);
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        __assert_fail("p3[y][x].a == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1c1,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0xed);
    lVar15 = lVar15 + 1;
    pcVar11 = pcVar11 + 0x1da;
    lVar14 = lVar14 + 0x768;
  } while (lVar15 != 0x77);
  operator_delete__(pvVar12);
  pvVar12 = operator_new__(0x37158);
  _Var7 = fileName._M_dataplus;
  if (multiPart) {
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"foo","");
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,1,_Var7._M_p,(string *)&fb,iVar9);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
  }
  else {
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"foo","");
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var7._M_p,(string *)&fb,iVar9);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  lVar14 = (long)pvVar12 + 6;
  lVar15 = 0;
  pcVar11 = pcVar10;
  do {
    lVar17 = 0;
    do {
      fVar3 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)(lVar14 + -6 + lVar17 * 8) * 4);
      pfVar1 = (float *)(_imath_half_to_float_table + (ulong)*(ushort *)(pcVar11 + lVar17 * 2) * 4);
      if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
        __assert_fail("p3[y][x].r == p2[y][x]",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1db,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar3 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)(lVar14 + -4 + lVar17 * 8) * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        __assert_fail("p3[y][x].g == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1dc,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar3 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)(lVar14 + -2 + lVar17 * 8) * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        __assert_fail("p3[y][x].b == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1dd,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar3 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(lVar14 + lVar17 * 8) * 4);
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        __assert_fail("p3[y][x].a == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x1de,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0xed);
    lVar15 = lVar15 + 1;
    pcVar11 = pcVar11 + 0x1da;
    lVar14 = lVar14 + 0x768;
  } while (lVar15 != 0x77);
  operator_delete__(pvVar12);
  pvVar12 = operator_new__(0x37158);
  _Var7 = fileName._M_dataplus;
  if (multiPart) {
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"");
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var7._M_p,(string *)&fb,iVar9);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"foo","");
    Imf_3_2::RgbaInputFile::setPartAndLayer((int)&out,(string *)0x1);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0x3b);
  }
  else {
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"");
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var7._M_p,(string *)&fb,iVar9);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"foo","");
    Imf_3_2::RgbaInputFile::setLayerName((string *)&out);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0x3b);
  }
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  uVar13 = 0;
  pcVar11 = pcVar16;
  pvVar18 = pvVar12;
  pcVar19 = pcVar10;
  do {
    lVar14 = 0;
    do {
      if (uVar13 < 0x3b) {
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)*(ushort *)(pcVar11 + lVar14 * 2) * 4
                          );
        if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
          __assert_fail("p3[y][x].r == p1[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x202,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
      }
      else {
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8) * 4);
        pfVar1 = (float *)(_imath_half_to_float_table + (ulong)*(ushort *)(pcVar19 + lVar14 * 2) * 4
                          );
        if ((fVar3 != *pfVar1) || (NAN(fVar3) || NAN(*pfVar1))) {
          __assert_fail("p3[y][x].r == p2[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x204,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
      }
      fVar3 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8 + 2) * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        __assert_fail("p3[y][x].g == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x206,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar3 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8 + 4) * 4);
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        __assert_fail("p3[y][x].b == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x207,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      fVar3 = *(float *)(_imath_half_to_float_table +
                        (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8 + 6) * 4);
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        __assert_fail("p3[y][x].a == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                      ,0x208,
                      "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xed);
    uVar13 = uVar13 + 1;
    pcVar19 = pcVar19 + 0x1da;
    pvVar18 = (void *)((long)pvVar18 + 0x768);
    pcVar11 = pcVar11 + 0x1da;
  } while (uVar13 != 0x77);
  operator_delete__(pvVar12);
  if (!multiPart) {
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    Imf_3_2::Header::Header
              ((Header *)&out,0xed,0x77,1.0,(Vec2 *)&fb,1.0,INCREASING_Y,ZIP_COMPRESSION);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&fb,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)0x1c959a);
    pcVar11 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&fb,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar11,(Channel *)"foo.Y");
    headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Imf_3_2::Slice::Slice((Slice *)&fb,HALF,pcVar16,2,0x1da,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&headers,(Slice *)0x1c959a);
    Imf_3_2::Slice::Slice((Slice *)&fb,HALF,pcVar10,2,0x1da,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&headers,(Slice *)"foo.Y");
    _Var7 = fileName._M_dataplus;
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::OutputFile::OutputFile((OutputFile *)&fb,_Var7._M_p,(Header *)&out,iVar9);
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&fb);
    Imf_3_2::OutputFile::writePixels((int)&fb);
    Imf_3_2::OutputFile::~OutputFile((OutputFile *)&fb);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&headers);
    Imf_3_2::Header::~Header((Header *)&out);
    _Var7 = fileName._M_dataplus;
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"");
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var7._M_p,(string *)&fb,iVar9);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    pvVar12 = operator_new__(0x37158);
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
    lVar14 = (long)pvVar12 + 6;
    lVar15 = 0;
    pcVar11 = pcVar16;
    do {
      lVar17 = 0;
      do {
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar14 + -6 + lVar17 * 8) * 4);
        fVar4 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(pcVar11 + lVar17 * 2) * 4
                          );
        if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
          __assert_fail("p3[y][x].r == p1[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x236,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar14 + -4 + lVar17 * 8) * 4);
        if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
          __assert_fail("p3[y][x].g == p1[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x237,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar14 + -2 + lVar17 * 8) * 4);
        if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
          __assert_fail("p3[y][x].b == p1[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x238,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
        fVar3 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(lVar14 + lVar17 * 8) * 4)
        ;
        if ((fVar3 != 1.0) || (NAN(fVar3))) {
          __assert_fail("p3[y][x].a == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x239,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0xed);
      lVar15 = lVar15 + 1;
      pcVar11 = pcVar11 + 0x1da;
      lVar14 = lVar14 + 0x768;
    } while (lVar15 != 0x77);
    operator_delete__(pvVar12);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
    _Var7 = fileName._M_dataplus;
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"foo","");
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var7._M_p,(string *)&fb,iVar9);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    pvVar12 = operator_new__(0x37158);
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
    lVar14 = (long)pvVar12 + 6;
    lVar15 = 0;
    pcVar11 = pcVar10;
    do {
      lVar17 = 0;
      do {
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar14 + -6 + lVar17 * 8) * 4);
        fVar4 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(pcVar11 + lVar17 * 2) * 4
                          );
        if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
          __assert_fail("p3[y][x].r == p2[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x249,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar14 + -4 + lVar17 * 8) * 4);
        if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
          __assert_fail("p3[y][x].g == p2[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x24a,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)(lVar14 + -2 + lVar17 * 8) * 4);
        if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
          __assert_fail("p3[y][x].b == p2[y][x]",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x24b,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
        fVar3 = *(float *)(_imath_half_to_float_table + (ulong)*(ushort *)(lVar14 + lVar17 * 8) * 4)
        ;
        if ((fVar3 != 1.0) || (NAN(fVar3))) {
          __assert_fail("p3[y][x].a == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x24c,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0xed);
      lVar15 = lVar15 + 1;
      pcVar11 = pcVar11 + 0x1da;
      lVar14 = lVar14 + 0x768;
    } while (lVar15 != 0x77);
    operator_delete__(pvVar12);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
    _Var7 = fileName._M_dataplus;
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"");
    iVar9 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var7._M_p,(string *)&fb,iVar9);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    pvVar12 = operator_new__(0x37158);
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0);
    fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppFVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&fb,"foo","");
    Imf_3_2::RgbaInputFile::setLayerName((string *)&out);
    if (fb.super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppFVar2) {
      operator_delete(fb.
                      super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)&((fb.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->_map)._M_t.
                              _M_impl.field_0x1);
    }
    Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)&out,(ulong)pvVar12,1);
    Imf_3_2::RgbaInputFile::readPixels((int)&out,0x3b);
    uVar13 = 0;
    pcVar11 = pcVar16;
    pvVar18 = pvVar12;
    pcVar19 = pcVar10;
    do {
      lVar14 = 0;
      do {
        if (uVar13 < 0x3b) {
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8) * 4);
          fVar4 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar11 + lVar14 * 2) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].r == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x264,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8 + 2) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].g == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x265,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8 + 4) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].b == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x266,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
        }
        else {
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8) * 4);
          fVar4 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)(pcVar19 + lVar14 * 2) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x26a,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8 + 2) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].g == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x26b,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
          fVar3 = *(float *)(_imath_half_to_float_table +
                            (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8 + 4) * 4);
          if ((fVar3 != fVar4) || (NAN(fVar3) || NAN(fVar4))) {
            __assert_fail("p3[y][x].b == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                          ,0x26c,
                          "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
          }
        }
        fVar3 = *(float *)(_imath_half_to_float_table +
                          (ulong)*(ushort *)((long)pvVar18 + lVar14 * 8 + 6) * 4);
        if ((fVar3 != 1.0) || (NAN(fVar3))) {
          __assert_fail("p3[y][x].a == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgba.cpp"
                        ,0x26f,
                        "void (anonymous namespace)::writeReadLayers(const std::string &, bool)");
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xed);
      uVar13 = uVar13 + 1;
      pcVar19 = pcVar19 + 0x1da;
      pvVar18 = (void *)((long)pvVar18 + 0x768);
      pcVar11 = pcVar11 + 0x1da;
    } while (uVar13 != 0x77);
    operator_delete__(pvVar12);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  }
  remove(fileName._M_dataplus._M_p);
  operator_delete__(pcVar10);
  operator_delete__(pcVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fileName._M_dataplus._M_p != &fileName.field_2) {
    operator_delete(fileName._M_dataplus._M_p,fileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
writeReadLayers (const std::string& tempDir, bool multiPart)
{
    if (multiPart) { cout << "\nreading multi-part file" << endl; }
    else
    {
        cout << "\nreading multi-layer file" << endl;
    }

    std::string fileName = tempDir + "imf_test_multi_layer_rgba.exr";

    const int W = 237;
    const int H = 119;

    Array2D<half> p1 (H, W);
    Array2D<half> p2 (H, W);

    int partForFooLayer = 0;

    if (multiPart) { partForFooLayer = 1; }

    for (int y = 0; y < H; ++y)
    {
        for (int x = 0; x < W; ++x)
        {
            p1[y][x] = half (y % 23 + x % 17);
            p2[y][x] = half (y % 29 + x % 19);
        }
    }

    {

        std::vector<Header> headers (2);
        {
            Header hdr (W, H);
            hdr.setType (SCANLINEIMAGE);
            headers[0] = hdr;
            headers[0].setName ("rgba_layer");
            if (multiPart)
            {
                headers[1] = hdr;
                headers[1].setName ("foo_layer");
            }
        }

        headers[0].channels ().insert ("R", Channel (HALF));
        headers[partForFooLayer].channels ().insert ("foo.R", Channel (HALF));

        vector<FrameBuffer> fb (2);

        fb[0].insert (
            "R",
            Slice (
                HALF,                // type
                (char*) &p1[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        fb[partForFooLayer].insert (
            "foo.R",
            Slice (
                HALF,                // type
                (char*) &p2[0][0],   // base
                sizeof (half),       // xStride
                sizeof (half) * W)); // yStride

        MultiPartOutputFile out (
            fileName.c_str (), headers.data (), multiPart ? 2 : 1);
        OutputPart part0 = OutputPart (out, 0);
        part0.setFrameBuffer (fb[0]);
        part0.writePixels (H);
        if (multiPart)
        {
            OutputPart part1 = OutputPart (out, 1);
            part1.setFrameBuffer (fb[1]);
            part1.writePixels (H);
        }
    }

    {

        Array2D<Rgba> p3 (H, W);
        if (multiPart)
        {
            RgbaInputFile in (fileName.c_str (), "");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }
        else
        {
            RgbaInputFile in (0, fileName.c_str (), "");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p1[y][x]);
                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {

        Array2D<Rgba> p3 (H, W);

        if (multiPart)
        {
            RgbaInputFile in (1, fileName.c_str (), "foo");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }
        else
        {
            RgbaInputFile in (fileName.c_str (), "foo");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);
        }

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                assert (p3[y][x].r == p2[y][x]);
                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    {
        Array2D<Rgba> p3 (H, W);
        if (multiPart)
        {
            RgbaInputFile in (fileName.c_str (), "");
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H / 2 - 1);

            in.setPartAndLayer (1, "foo");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (H / 2, H - 1);
        }
        else
        {
            RgbaInputFile in (fileName.c_str (), "");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H / 2 - 1);

            in.setLayerName ("foo");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (H / 2, H - 1);
        }

        for (int y = 0; y < H; ++y)
        {
            for (int x = 0; x < W; ++x)
            {
                if (y < H / 2)
                    assert (p3[y][x].r == p1[y][x]);
                else
                    assert (p3[y][x].r == p2[y][x]);

                assert (p3[y][x].g == 0);
                assert (p3[y][x].b == 0);
                assert (p3[y][x].a == 1);
            }
        }
    }

    if (!multiPart)
    {
        {
            Header hdr (W, H);
            hdr.channels ().insert ("Y", Channel (HALF));
            hdr.channels ().insert ("foo.Y", Channel (HALF));

            FrameBuffer fb;

            fb.insert (
                "Y",
                Slice (
                    HALF,                // type
                    (char*) &p1[0][0],   // base
                    sizeof (half),       // xStride
                    sizeof (half) * W)); // yStride

            fb.insert (
                "foo.Y",
                Slice (
                    HALF,                // type
                    (char*) &p2[0][0],   // base
                    sizeof (half),       // xStride
                    sizeof (half) * W)); // yStride

            OutputFile out (fileName.c_str (), hdr);
            out.setFrameBuffer (fb);
            out.writePixels (H);
        }

        {
            RgbaInputFile in (fileName.c_str (), "");

            Array2D<Rgba> p3 (H, W);
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);

            for (int y = 0; y < H; ++y)
            {
                for (int x = 0; x < W; ++x)
                {
                    assert (p3[y][x].r == p1[y][x]);
                    assert (p3[y][x].g == p1[y][x]);
                    assert (p3[y][x].b == p1[y][x]);
                    assert (p3[y][x].a == 1);
                }
            }
        }

        {
            RgbaInputFile in (fileName.c_str (), "foo");

            Array2D<Rgba> p3 (H, W);
            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H - 1);

            for (int y = 0; y < H; ++y)
            {
                for (int x = 0; x < W; ++x)
                {
                    assert (p3[y][x].r == p2[y][x]);
                    assert (p3[y][x].g == p2[y][x]);
                    assert (p3[y][x].b == p2[y][x]);
                    assert (p3[y][x].a == 1);
                }
            }
        }

        {
            RgbaInputFile in (fileName.c_str (), "");

            Array2D<Rgba> p3 (H, W);

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (0, H / 2 - 1);

            in.setLayerName ("foo");

            in.setFrameBuffer (&p3[0][0], 1, W);
            in.readPixels (H / 2, H - 1);

            for (int y = 0; y < H; ++y)
            {
                for (int x = 0; x < W; ++x)
                {
                    if (y < H / 2)
                    {
                        assert (p3[y][x].r == p1[y][x]);
                        assert (p3[y][x].g == p1[y][x]);
                        assert (p3[y][x].b == p1[y][x]);
                    }
                    else
                    {
                        assert (p3[y][x].r == p2[y][x]);
                        assert (p3[y][x].g == p2[y][x]);
                        assert (p3[y][x].b == p2[y][x]);
                    }

                    assert (p3[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName.c_str ());
}